

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O1

SeedBuilder * tcu::operator<<(SeedBuilder *builder,deUint8 value)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  uVar2 = (uint)(value ^ 0x8c) ^ builder->m_hash;
  lVar3 = 8;
  do {
    uVar4 = uVar2 >> 1;
    uVar1 = uVar2 & 1;
    uVar2 = uVar4 ^ 0x4c11db7;
    if (uVar1 == 0) {
      uVar2 = uVar4;
    }
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  builder->m_hash = uVar2;
  return builder;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, deUint8 value)
{
	const deUint8 val = value ^ 140u;

	builder.feed(sizeof(val), &val);
	return builder;
}